

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O1

_Bool bson_append_timeval(bson_t *bson,char *key,int key_length,timeval *value)

{
  int iVar1;
  _Bool _Var2;
  time_t tVar3;
  uint8_t *puVar4;
  undefined8 *puVar5;
  uint key_length_00;
  int key_length_01;
  ulong unaff_RBX;
  bson_t abStack_180 [2];
  ulong uStack_48;
  
  if (bson == (bson_t *)0x0) {
    bson_append_timeval_cold_3();
LAB_0010ccab:
    bson_append_timeval_cold_2();
  }
  else {
    if (key == (char *)0x0) goto LAB_0010ccab;
    if (value != (timeval *)0x0) {
      _Var2 = bson_append_date_time
                        (bson,key,key_length,value->tv_sec * 1000 + (ulong)value->tv_usec / 1000);
      return _Var2;
    }
  }
  bson_append_timeval_cold_1();
  if (bson == (bson_t *)0x0) {
    bson_append_now_utc_cold_3();
LAB_0010ccf6:
    bson_append_now_utc_cold_2();
  }
  else {
    if (key == (char *)0x0) goto LAB_0010ccf6;
    unaff_RBX = (ulong)key_length_00;
    if (-2 < (int)key_length_00) {
      tVar3 = time((time_t *)0x0);
      _Var2 = bson_append_date_time(bson,key,key_length_00,tVar3 * 1000);
      return _Var2;
    }
  }
  bson_append_now_utc_cold_1();
  uStack_48 = unaff_RBX;
  if (bson == (bson_t *)0x0) {
    bson_append_value_cold_3();
LAB_0010cfba:
    bson_append_value_cold_2();
LAB_0010cfbf:
    bson_append_value_cold_1();
    if (bson != (bson_t *)0x0) {
      bson->flags = 3;
      bson->len = 5;
      bson->padding[0] = '\x05';
      bson->padding[1] = '\0';
      bson->padding[2] = '\0';
      bson->padding[3] = '\0';
      bson->padding[4] = '\0';
      return true;
    }
    bson_init_cold_1();
    if (bson != (bson_t *)0x0) {
      if ((bson->flags & 1) == 0) {
        puVar4 = (uint8_t *)(**(long **)(bson->padding + 0x10) + *(long *)(bson->padding + 0x20));
      }
      else {
        puVar4 = bson->padding;
      }
      bson->len = 5;
      *puVar4 = '\x05';
      puVar4[1] = '\0';
      puVar4[2] = '\0';
      puVar4[3] = '\0';
      puVar4[4] = '\0';
      return SUB81(puVar4,0);
    }
    bson_reinit_cold_1();
    puVar5 = (undefined8 *)bson_malloc(0x80);
    *puVar5 = 0x500000001;
    *(undefined1 *)(puVar5 + 1) = 5;
    *(undefined4 *)((long)puVar5 + 9) = 0;
    return SUB81(puVar5,0);
  }
  if (key == (char *)0x0) goto LAB_0010cfba;
  if (value == (timeval *)0x0) goto LAB_0010cfbf;
  iVar1 = (int)value->tv_sec;
  switch(iVar1) {
  case 1:
    _Var2 = bson_append_double(bson,key,key_length_01,(double)value->tv_usec);
    break;
  case 2:
    _Var2 = bson_append_utf8(bson,key,key_length_01,(char *)value->tv_usec,(int)value[1].tv_sec);
    break;
  case 3:
    _Var2 = bson_init_static(abStack_180,(uint8_t *)value->tv_usec,(ulong)(uint)value[1].tv_sec);
    if (_Var2) {
      _Var2 = bson_append_document(bson,key,key_length_01,abStack_180);
LAB_0010ceb7:
      bson_destroy(abStack_180);
      return _Var2;
    }
    goto LAB_0010cec3;
  case 4:
    _Var2 = bson_init_static(abStack_180,(uint8_t *)value->tv_usec,(ulong)(uint)value[1].tv_sec);
    if (_Var2) {
      _Var2 = bson_append_array(bson,key,key_length_01,abStack_180);
      goto LAB_0010ceb7;
    }
    goto LAB_0010cec3;
  case 5:
    _Var2 = bson_append_binary(bson,key,key_length_01,
                               *(bson_subtype_t *)((long)&value[1].tv_sec + 4),
                               (uint8_t *)value->tv_usec,(uint32_t)value[1].tv_sec);
    break;
  case 6:
    _Var2 = bson_append_undefined(bson,key,key_length_01);
    break;
  case 7:
    _Var2 = bson_append_oid(bson,key,key_length_01,(bson_oid_t *)&value->tv_usec);
    break;
  case 8:
    _Var2 = bson_append_bool(bson,key,key_length_01,SUB81(value->tv_usec,0));
    break;
  case 9:
    _Var2 = bson_append_date_time(bson,key,key_length_01,value->tv_usec);
    break;
  case 10:
    _Var2 = bson_append_null(bson,key,key_length_01);
    break;
  case 0xb:
    _Var2 = bson_append_regex(bson,key,key_length_01,(char *)value->tv_usec,(char *)value[1].tv_sec)
    ;
    break;
  case 0xc:
    _Var2 = bson_append_dbpointer
                      (bson,key,key_length_01,(char *)value->tv_usec,
                       (bson_oid_t *)((long)&value[1].tv_sec + 4));
    break;
  case 0xd:
    _Var2 = bson_append_code(bson,key,key_length_01,(char *)value->tv_usec);
    break;
  case 0xe:
    _Var2 = bson_append_symbol(bson,key,key_length_01,(char *)value->tv_usec,(int)value[1].tv_sec);
    break;
  case 0xf:
    _Var2 = bson_init_static(abStack_180,(uint8_t *)value[1].tv_sec,
                             (ulong)*(uint *)((long)&value[1].tv_usec + 4));
    if (_Var2) {
      _Var2 = bson_append_code_with_scope(bson,key,key_length_01,(char *)value->tv_usec,abStack_180)
      ;
      goto LAB_0010ceb7;
    }
    goto LAB_0010cec3;
  case 0x10:
    _Var2 = bson_append_int32(bson,key,key_length_01,(int32_t)value->tv_usec);
    break;
  case 0x11:
    _Var2 = bson_append_timestamp
                      (bson,key,key_length_01,(uint32_t)value->tv_usec,
                       *(uint32_t *)((long)&value->tv_usec + 4));
    break;
  case 0x12:
    _Var2 = bson_append_int64(bson,key,key_length_01,value->tv_usec);
    break;
  case 0x13:
    _Var2 = bson_append_decimal128(bson,key,key_length_01,(bson_decimal128_t *)&value->tv_usec);
    break;
  default:
    if (iVar1 == 0x7f) {
      _Var2 = bson_append_maxkey(bson,key,key_length_01);
      return _Var2;
    }
    if (iVar1 == 0xff) {
      _Var2 = bson_append_minkey(bson,key,key_length_01);
      return _Var2;
    }
LAB_0010cec3:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool
bson_append_timeval (bson_t *bson,
                     const char *key,
                     int key_length,
                     struct timeval *value)
{
   uint64_t unix_msec;

   BSON_ASSERT (bson);
   BSON_ASSERT (key);
   BSON_ASSERT (value);

   unix_msec =
      (((uint64_t) value->tv_sec) * 1000UL) + (value->tv_usec / 1000UL);
   return bson_append_date_time (bson, key, key_length, unix_msec);
}